

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

bool __thiscall rengine::rect2d::contains(rect2d *this,vec2 p)

{
  bool local_21;
  rect2d *this_local;
  vec2 p_local;
  
  if ((this->br).x <= (this->tl).x) {
    __assert_fail("tl.x < br.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/mathtypes.h"
                  ,600,"bool rengine::rect2d::contains(vec2) const");
  }
  if ((this->tl).y < (this->br).y) {
    this_local._0_4_ = p.x;
    local_21 = false;
    if ((((this->tl).x <= this_local._0_4_) && (local_21 = false, this_local._0_4_ <= (this->br).x))
       && (this_local._4_4_ = p.y, local_21 = false, (this->tl).y <= this_local._4_4_)) {
      local_21 = this_local._4_4_ <= (this->br).y;
    }
    return local_21;
  }
  __assert_fail("tl.y < br.y",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/mathtypes.h"
                ,0x259,"bool rengine::rect2d::contains(vec2) const");
}

Assistant:

bool contains(vec2 p) const {
        assert(tl.x < br.x);
        assert(tl.y < br.y);
        return p.x >= tl.x && p.x <= br.x
            && p.y >= tl.y && p.y <= br.y;
    }